

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_bary3d(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  REF_DBL *xyz0;
  REF_DBL *xyz1;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  REF_DBL xyzp [3];
  REF_DBL total_normal [3];
  REF_DBL normal [3];
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar2 = ref_node->max, iVar1 < iVar2)) &&
     (pRVar5 = ref_node->global, -1 < pRVar5[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < iVar2 && -1 < (int)uVar3) && (-1 < pRVar5[uVar3])) {
      uVar4 = nodes[2];
      if (((int)uVar4 < iVar2 && -1 < (int)uVar4) && (-1 < pRVar5[uVar4])) {
        pRVar6 = ref_node->real;
        xyz0 = pRVar6 + (uint)(iVar1 * 0xf);
        xyz1 = pRVar6 + uVar3 * 0xf;
        pRVar6 = pRVar6 + uVar4 * 0xf;
        ref_node_xyz_normal(xyz0,xyz1,pRVar6,&local_68);
        dVar7 = *xyz - *xyz0;
        dVar8 = xyz[1] - xyz0[1];
        dVar10 = xyz[2] - xyz0[2];
        dVar12 = dVar10 * local_58 + dVar7 * local_68 + dVar8 * local_60;
        local_88 = (dVar7 - local_68 * dVar12) + *xyz0;
        local_80 = (dVar8 - local_60 * dVar12) + xyz0[1];
        local_78 = (dVar10 - dVar12 * local_58) + xyz0[2];
        ref_node_xyz_normal(&local_88,xyz1,pRVar6,&local_48);
        dVar8 = local_38 * local_58 + local_48 * local_68 + local_40 * local_60;
        *bary = dVar8;
        ref_node_xyz_normal(xyz0,&local_88,pRVar6,&local_48);
        dVar10 = local_38 * local_58 + local_48 * local_68 + local_40 * local_60;
        bary[1] = dVar10;
        ref_node_xyz_normal(xyz0,xyz1,&local_88,&local_48);
        dVar9 = local_58 * local_38 + local_68 * local_48 + local_60 * local_40;
        bary[2] = dVar9;
        dVar12 = dVar8 + dVar10 + dVar9;
        dVar7 = dVar12 * 1e+20;
        if (dVar7 <= -dVar7) {
          dVar7 = -dVar7;
        }
        dVar11 = dVar8;
        if (dVar8 <= -dVar8) {
          dVar11 = -dVar8;
        }
        if (dVar11 < dVar7) {
          dVar11 = dVar10;
          if (dVar10 <= -dVar10) {
            dVar11 = -dVar10;
          }
          if (dVar11 < dVar7) {
            dVar11 = dVar9;
            if (dVar9 <= -dVar9) {
              dVar11 = -dVar9;
            }
            if (dVar11 < dVar7) {
              *bary = dVar8 / dVar12;
              bary[1] = dVar10 / dVar12;
              bary[2] = dVar9 / dVar12;
              return 0;
            }
          }
        }
        printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xb1e,"ref_node_bary3d");
        *bary = 0.0;
        bary[1] = 0.0;
        bary[2] = 0.0;
        return 4;
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xaf8,
         "ref_node_bary3d",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary3d(REF_NODE ref_node, REF_INT *nodes,
                                   REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *xyz0, *xyz1, *xyz2;
  REF_DBL total, normal[3], total_normal[3];
  REF_DBL xyzp[3];

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, total_normal), "n0");

  /* projects query point to triangle plane */
  xyzp[0] = xyz[0] - xyz0[0];
  xyzp[1] = xyz[1] - xyz0[1];
  xyzp[2] = xyz[2] - xyz0[2];
  total = ref_math_dot(xyzp, total_normal);
  xyzp[0] -= total_normal[0] * total;
  xyzp[1] -= total_normal[1] * total;
  xyzp[2] -= total_normal[2] * total;
  xyzp[0] += xyz0[0];
  xyzp[1] += xyz0[1];
  xyzp[2] += xyz0[2];

  RSS(ref_node_xyz_normal(xyzp, xyz1, xyz2, normal), "n0");
  bary[0] = ref_math_dot(normal, total_normal);
  RSS(ref_node_xyz_normal(xyz0, xyzp, xyz2, normal), "n1");
  bary[1] = ref_math_dot(normal, total_normal);
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyzp, normal), "n2");
  bary[2] = ref_math_dot(normal, total_normal);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}